

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ResolveSelectNames(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  Walker w;
  Walker local_30;
  
  local_30.xExprCallback = resolveExprStep;
  local_30.xSelectCallback = resolveSelectStep;
  local_30.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_30.pParse = pParse;
  local_30.u.pNC = pOuterNC;
  sqlite3WalkSelect(&local_30,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResolveSelectNames(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for parent SELECT statement */
){
  Walker w;

  assert( p!=0 );
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.pParse = pParse;
  w.u.pNC = pOuterNC;
  sqlite3WalkSelect(&w, p);
}